

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O0

bool ppmb_read(string *input_name,int *xsize,int *ysize,int *maxrgb,uchar **r,uchar **g,uchar **b)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  uchar *puVar5;
  long local_250;
  ifstream input;
  bool error;
  uchar **g_local;
  uchar **r_local;
  int *maxrgb_local;
  int *ysize_local;
  int *xsize_local;
  string *input_name_local;
  
  std::ifstream::ifstream(&local_250);
  _Var3 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)&local_250,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_250 + *(long *)(local_250 + -0x18)));
  if ((bVar1 & 1) == 0) {
    bVar2 = ppmb_read_header((ifstream *)&local_250,xsize,ysize,maxrgb);
    if (bVar2) {
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"PPMB_READ - Fatal error!\n");
      std::operator<<((ostream *)&std::cout,"  PPMB_READ_HEADER failed.\n");
      input_name_local._7_1_ = true;
    }
    else {
      puVar5 = (uchar *)operator_new__((long)(*xsize * *ysize));
      *r = puVar5;
      puVar5 = (uchar *)operator_new__((long)(*xsize * *ysize));
      *g = puVar5;
      puVar5 = (uchar *)operator_new__((long)(*xsize * *ysize));
      *b = puVar5;
      bVar2 = ppmb_read_data((ifstream *)&local_250,*xsize,*ysize,*r,*g,*b);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"PPMB_READ - Fatal error!\n");
        std::operator<<((ostream *)&std::cout,"  PPMB_READ_DATA failed.\n");
        input_name_local._7_1_ = true;
      }
      else {
        std::ifstream::close();
        input_name_local._7_1_ = false;
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"PPMB_READ - Fatal error!\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"  Cannot open the input file \"");
    poVar4 = std::operator<<(poVar4,(string *)input_name);
    std::operator<<(poVar4,"\".\n");
    input_name_local._7_1_ = true;
  }
  std::ifstream::~ifstream(&local_250);
  return input_name_local._7_1_;
}

Assistant:

bool ppmb_read ( string input_name, int &xsize, int &ysize, int &maxrgb,
  unsigned char **r, unsigned char **g, unsigned char **b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_READ reads the header and data from a binary portable pixel map file.
//
//  Discussion:
//
//    Thanks to Jonas Schwertfeger for pointing out that, especially on 
//    Microsoft Windows systems, a binary file needs to be opened as a binary 
//    file!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
// 
//    22 July 2011
// 
//  Author:
// 
//    John Burkardt
//
//  Parameters:
//
//    Input, string INPUT_NAME, the name of the file containing the binary
//    portable pixel map data.
//
//    Output, int &XSIZE, &YSIZE, the number of rows and columns of data.
//
//    Output, int &MAXRGB, the maximum RGB value.
//
//    Output, unsigned char **R, **G, **B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_READ, is true if there was an error.
//
{
  bool error;
  ifstream input;

  input.open ( input_name.c_str ( ), ios::binary );

  if ( !input )
  {
    cout << "\n";
    cout << "PPMB_READ - Fatal error!\n";
    cout << "  Cannot open the input file \"" << input_name << "\".\n";
    return true;
  }
//
//  Read the header.
//
  error = ppmb_read_header ( input, xsize, ysize, maxrgb );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_READ - Fatal error!\n";
    cout << "  PPMB_READ_HEADER failed.\n";
    return true;
  }
//
//  Allocate storage for the data.
//
  *r = new unsigned char[xsize * ysize];
  *g = new unsigned char[xsize * ysize];
  *b = new unsigned char[xsize * ysize];
//
//  Read the data.
//
  error = ppmb_read_data ( input, xsize, ysize, *r, *g, *b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_READ - Fatal error!\n";
    cout << "  PPMB_READ_DATA failed.\n";
    return true;
  }
//
//  Close the file.
//
  input.close ( );

  return false;
}